

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

bool __thiscall
Js::FunctionBody::CanInlineRecursively(FunctionBody *this,uint depth,bool tryAggressive)

{
  DynamicProfileInfo *pDVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint32 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  double dVar9;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar10 [16];
  
  uVar7 = DAT_015a1edc;
  uVar4 = DAT_015a1ed8;
  uVar3 = DAT_015a1ed4;
  pDVar1 = (this->dynamicProfileInfo).ptr;
  uVar8 = 0;
  if ((pDVar1 != (DynamicProfileInfo *)0x0) &&
     (uVar6 = pDVar1->m_recursiveInlineInfo, uVar8 = 0, uVar6 != 0)) {
    uVar8 = 0;
    do {
      uVar8 = uVar8 + (uVar6 & 1);
      bVar2 = 1 < uVar6;
      uVar6 = uVar6 >> 1;
    } while (bVar2);
  }
  if (tryAggressive && uVar8 == this->profiledCallSiteCount) {
    uVar5 = GetCountField(this,ByteCodeWithoutLDACount);
    uVar6 = (uint)((ulong)uVar3 / (ulong)uVar5);
    if (uVar8 != 1) {
      dVar9 = log((double)(int)uVar8);
      auVar10._0_8_ = log((double)((ulong)uVar3 / (ulong)uVar5) / dVar9);
      auVar10._8_8_ = extraout_XMM0_Qb;
      auVar10 = roundsd(auVar10,auVar10,10);
      uVar6 = (uint)(long)auVar10._0_8_;
    }
    if (uVar7 < uVar6) {
      uVar7 = uVar6;
    }
    if (uVar4 <= uVar7) {
      uVar7 = uVar4;
    }
  }
  return depth < uVar7;
}

Assistant:

bool FunctionBody::CanInlineRecursively(uint depth, bool tryAggressive)
    {
        uint recursiveInlineSpan = this->GetNumberOfRecursiveCallSites();

        uint minRecursiveInlineDepth = (uint)CONFIG_FLAG(RecursiveInlineDepthMin);

        if (recursiveInlineSpan != this->GetProfiledCallSiteCount() || tryAggressive == false)
        {
            return depth < minRecursiveInlineDepth;
        }

        uint maxRecursiveInlineDepth = (uint)CONFIG_FLAG(RecursiveInlineDepthMax);
        uint maxRecursiveBytecodeBudget = (uint)CONFIG_FLAG(RecursiveInlineThreshold);
        uint numberOfAllowedFuncs = maxRecursiveBytecodeBudget / this->GetByteCodeWithoutLDACount();
        uint maxDepth;

        if (recursiveInlineSpan == 1)
        {
            maxDepth = numberOfAllowedFuncs;
        }
        else
        {
            maxDepth = (uint)ceil(log((double)((double)numberOfAllowedFuncs) / log((double)recursiveInlineSpan)));
        }
        maxDepth = maxDepth < minRecursiveInlineDepth ? minRecursiveInlineDepth : maxDepth;
        maxDepth = maxDepth < maxRecursiveInlineDepth ? maxDepth : maxRecursiveInlineDepth;
        return depth < maxDepth;
    }